

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

int nn_chunk_realloc(size_t size,void **chunk)

{
  void *p;
  ulong __n;
  int iVar1;
  nn_chunk *pnVar2;
  ulong uVar3;
  void *pvVar4;
  void *local_38;
  
  p = *chunk;
  pnVar2 = nn_chunk_getptr(p);
  if ((pnVar2->refcount).n == 1) {
    __n = pnVar2->size;
    uVar3 = size - __n;
    if (size < __n || uVar3 == 0) {
      pnVar2->size = size;
    }
    else {
      if (0xffffffffffffffdf < size) {
        return -0xc;
      }
      if ((ulong)((long)p + (-0x20 - (long)pnVar2)) < uVar3) goto LAB_001470f3;
      pvVar4 = (void *)((long)p - uVar3);
      memmove(pvVar4,p,__n);
      pnVar2->size = size;
      nn_putl((uint8_t *)((long)pvVar4 + -4),0xdeadcafe);
      nn_putl((uint8_t *)((long)pvVar4 + -8),((int)pvVar4 - (int)pnVar2) - 0x20);
      *chunk = p;
    }
    iVar1 = 0;
  }
  else {
LAB_001470f3:
    local_38 = (void *)0x0;
    iVar1 = nn_chunk_alloc(size,0,&local_38);
    pvVar4 = local_38;
    if (iVar1 == 0) {
      memcpy(local_38,&pnVar2[1].size,pnVar2->size);
      *chunk = pvVar4;
      nn_chunk_free(p);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int nn_chunk_realloc (size_t size, void **chunk)
{
    struct nn_chunk *self;
    void *new_ptr;
    size_t hdr_size;
    int rc;
    void *p = *chunk;

    self = nn_chunk_getptr (p);

    /*  Check if we only have one reference to this object, in that case we can
        reallocate the memory chunk. */
    if (self->refcount.n == 1) {

         size_t grow;
         size_t empty;

        /*  If the new size is smaller than the old size, we can just keep
            it.  Avoid an allocation.  We'll have wasted & lost data
            at the end, but who cares.  This is basically "chop". */
        if (size <= self->size) {
            self->size = size;
            return (0);
        }

        hdr_size = nn_chunk_hdrsize ();
        empty = (uint8_t*) p - (uint8_t*) self - hdr_size;
        grow = size - self->size;

        /* Check for overflow. */
        if (hdr_size + size < size) {
            return -ENOMEM;
	}

        /* Can we grow into empty space? */
        if (grow <= empty) {
            new_ptr = (uint8_t *)p - grow;
            memmove (new_ptr, p, self->size);
            self->size = size;

            /*  Recalculate the size of empty space, and reconstruct
                the tag and prefix. */
            empty = (uint8_t *)new_ptr - (uint8_t *)self - hdr_size;
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 1), NN_CHUNK_TAG);
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 2), (uint32_t) empty);
            *chunk = p;
            return (0);
        }
    }

    /*  There are either multiple references to this memory chunk,
        or we cannot reuse the existing space.  We create a new one
        copy the data.  (This is no worse than nn_realloc, btw.) */
    new_ptr = NULL;
    rc = nn_chunk_alloc (size, 0, &new_ptr);

    if (nn_slow (rc != 0)) {
        return rc;
    }

    memcpy (new_ptr, nn_chunk_getdata (self), self->size);
    *chunk = new_ptr;
    nn_chunk_free (p);

    return 0;
}